

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_scan_for_html_closer
              (MD_CTX *ctx,MD_CHAR *str,MD_SIZE len,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,
              MD_OFFSET max_end,MD_OFFSET *p_end,MD_OFFSET *p_scan_horizon)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  if (*p_scan_horizon <= beg || *p_scan_horizon < max_end - len) {
    uVar2 = 0;
    while( true ) {
      uVar3 = lines[uVar2].end;
      if (max_end <= lines[uVar2].end) {
        uVar3 = max_end;
      }
      for (; len + beg <= uVar3; beg = beg + 1) {
        iVar1 = md_ascii_eq(ctx->text + beg,str,len);
        if (iVar1 != 0) {
          *p_end = len + beg;
          return 1;
        }
      }
      uVar2 = uVar2 + 1;
      if ((n_lines <= uVar2) || (max_end <= beg)) break;
      beg = lines[uVar2].beg;
    }
    *p_scan_horizon = beg;
  }
  return 0;
}

Assistant:

static int
md_scan_for_html_closer(MD_CTX* ctx, const MD_CHAR* str, MD_SIZE len,
                        const MD_LINE* lines, MD_SIZE n_lines,
                        OFF beg, OFF max_end, OFF* p_end,
                        OFF* p_scan_horizon)
{
    OFF off = beg;
    MD_SIZE line_index = 0;

    if(off < *p_scan_horizon  &&  *p_scan_horizon >= max_end - len) {
        /* We have already scanned the range up to the max_end so we know
         * there is nothing to see. */
        return FALSE;
    }

    while(TRUE) {
        while(off + len <= lines[line_index].end  &&  off + len <= max_end) {
            if(md_ascii_eq(STR(off), str, len)) {
                /* Success. */
                *p_end = off + len;
                return TRUE;
            }
            off++;
        }

        line_index++;
        if(off >= max_end  ||  line_index >= n_lines) {
            /* Failure. */
            *p_scan_horizon = off;
            return FALSE;
        }

        off = lines[line_index].beg;
    }
}